

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_util.cpp
# Opt level: O0

void duckdb::HTTPUtil::ParseHTTPProxyHost
               (string *proxy_value,string *hostname_out,idx_t *port_out,idx_t default_port)

{
  string_t input;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  undefined8 uVar4;
  undefined8 in_RCX;
  undefined8 *in_RDX;
  string *in_RSI;
  string *in_RDI;
  idx_t port;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  proxy_split;
  string sanitized_proxy_value;
  size_type in_stack_fffffffffffffdf8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffffe00;
  allocator *paVar5;
  string *in_stack_fffffffffffffe08;
  string_t *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  string local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  InvalidInputException *in_stack_fffffffffffffe70;
  allocator local_181;
  string local_180 [39];
  undefined1 local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [48];
  undefined8 local_100;
  allocator local_f1;
  string local_f0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0 [24];
  string local_b8 [39];
  allocator local_91;
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  undefined8 local_20;
  undefined8 *local_18;
  string *local_10;
  string *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ::std::__cxx11::string::string(local_40,in_RDI);
  ::std::__cxx11::string::string(local_60,local_8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_90,"http://",&local_91);
  bVar1 = StringUtil::StartsWith(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  ::std::__cxx11::string::~string(local_90);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
  ::std::__cxx11::string::~string(local_60);
  if (bVar1) {
    ::std::__cxx11::string::substr((ulong)local_b8,(ulong)local_8);
    ::std::__cxx11::string::operator=(local_40,local_b8);
    ::std::__cxx11::string::~string(local_b8);
  }
  paVar5 = &local_f1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_f0,":",paVar5);
  StringUtil::Split(in_stack_fffffffffffffe68,(string *)in_stack_fffffffffffffe60);
  ::std::__cxx11::string::~string(local_f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  sVar2 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_d0);
  if (sVar2 == 1) {
    pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    ::std::__cxx11::string::operator=(local_10,(string *)pvVar3);
    *local_18 = local_20;
  }
  else {
    sVar2 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_d0);
    if (sVar2 != 2) {
      uVar4 = __cxa_allocate_exception(0x10);
      paVar5 = &local_181;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_180,"Failed to parse http_proxy \'%s\' into a host and port",paVar5);
      ::std::__cxx11::string::string(local_1a8,local_8);
      InvalidInputException::
      InvalidInputException<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      __cxa_throw(uVar4,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    operator[](in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    string_t::string_t(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    input.value.pointer.ptr = (char *)in_stack_fffffffffffffe10;
    input.value._0_8_ = in_stack_fffffffffffffe08;
    bVar1 = TryCast::Operation<duckdb::string_t,_unsigned_long>
                      (input,(uint64_t *)in_stack_fffffffffffffe00,
                       SUB81(in_stack_fffffffffffffdf8 >> 0x38,0));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_159 = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_130,"Failed to parse port from http_proxy \'%s\'",&local_131);
      ::std::__cxx11::string::string(local_158,local_8);
      InvalidInputException::
      InvalidInputException<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      local_159 = 0;
      __cxa_throw(uVar4,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    ::std::__cxx11::string::operator=(local_10,(string *)pvVar3);
    *local_18 = local_100;
  }
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x2d62196);
  ::std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void HTTPUtil::ParseHTTPProxyHost(string &proxy_value, string &hostname_out, idx_t &port_out, idx_t default_port) {
	auto sanitized_proxy_value = proxy_value;
	if (StringUtil::StartsWith(proxy_value, "http://")) {
		sanitized_proxy_value = proxy_value.substr(7);
	}
	auto proxy_split = StringUtil::Split(sanitized_proxy_value, ":");
	if (proxy_split.size() == 1) {
		hostname_out = proxy_split[0];
		port_out = default_port;
	} else if (proxy_split.size() == 2) {
		idx_t port;
		if (!TryCast::Operation<string_t, idx_t>(proxy_split[1], port, false)) {
			throw InvalidInputException("Failed to parse port from http_proxy '%s'", proxy_value);
		}
		hostname_out = proxy_split[0];
		port_out = port;
	} else {
		throw InvalidInputException("Failed to parse http_proxy '%s' into a host and port", proxy_value);
	}
}